

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O1

QMetaEnum metaEnumFromType(QMetaType t)

{
  Data *pDVar1;
  Data *pDVar2;
  bool bVar3;
  int index;
  QMetaObject *this;
  qsizetype qVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QByteArrayView needle;
  QByteArrayView haystack;
  QMetaEnum QVar6;
  QByteArray local_58;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((t.d_ptr != (QMetaTypeInterface *)0x0) && (((t.d_ptr)->flags & 0x10) != 0)) {
    if ((t.d_ptr == (QMetaTypeInterface *)0x0) || ((t.d_ptr)->metaObjectFn == (MetaObjectFn)0x0)) {
      this = (QMetaObject *)0x0;
    }
    else {
      this = (*(t.d_ptr)->metaObjectFn)(t.d_ptr);
    }
    if (this != (QMetaObject *)0x0) {
      local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      if (t.d_ptr == (QMetaTypeInterface *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = (t.d_ptr)->name;
      }
      QByteArray::QByteArray(&local_38,pcVar5,-1);
      if (((undefined1 *)local_38.d.size != (undefined1 *)0x0) &&
         (local_38.d.ptr[(long)(local_38.d.size + -1)] == '>')) {
        needle.m_data = "QFlags<";
        needle.m_size = 7;
        haystack.m_data = local_38.d.ptr;
        haystack.m_size = local_38.d.size;
        bVar3 = QtPrivate::startsWith(haystack,needle);
        if (bVar3) {
          QByteArray::chop(&local_38,1);
          QByteArray::QByteArray(&local_58,local_38.d.ptr + 7,(qsizetype)(local_38.d.size + -7));
          pcVar5 = local_38.d.ptr;
          pDVar2 = local_38.d.d;
          qVar4 = local_58.d.size;
          pDVar1 = local_58.d.d;
          local_58.d.d = local_38.d.d;
          local_38.d.d = pDVar1;
          local_38.d.ptr = local_58.d.ptr;
          local_58.d.ptr = pcVar5;
          local_58.d.size = local_38.d.size;
          local_38.d.size = qVar4;
          if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar2->super_QArrayData,1,0x10);
            }
          }
        }
      }
      qVar4 = QByteArray::lastIndexOf(&local_38,':',-1);
      if (qVar4 != -1) {
        QByteArray::QByteArray(&local_58,local_38.d.ptr + qVar4 + 1,local_38.d.size - (qVar4 + 1));
        pcVar5 = local_38.d.ptr;
        pDVar2 = local_38.d.d;
        qVar4 = local_58.d.size;
        pDVar1 = local_58.d.d;
        local_58.d.d = local_38.d.d;
        local_38.d.d = pDVar1;
        local_38.d.ptr = local_58.d.ptr;
        local_58.d.ptr = pcVar5;
        local_58.d.size = local_38.d.size;
        local_38.d.size = qVar4;
        if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar2->super_QArrayData,1,0x10);
          }
        }
      }
      pcVar5 = local_38.d.ptr;
      if (local_38.d.ptr == (char *)0x0) {
        pcVar5 = "";
      }
      index = QMetaObject::indexOfEnumerator(this,pcVar5);
      QVar6 = QMetaObject::enumerator(this,index);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_0029c5e2;
    }
  }
  QVar6 = (QMetaEnum)ZEXT816(0);
LAB_0029c5e2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

static QMetaEnum metaEnumFromType(QMetaType t)
{
    if (t.flags() & QMetaType::IsEnumeration) {
        if (const QMetaObject *metaObject = t.metaObject()) {
            QByteArrayView qflagsNamePrefix = "QFlags<";
            QByteArray enumName = t.name();
            if (enumName.endsWith('>') && enumName.startsWith(qflagsNamePrefix)) {
                // extract the template argument
                enumName.chop(1);
                enumName = enumName.sliced(qflagsNamePrefix.size());
            }
            if (qsizetype lastColon = enumName.lastIndexOf(':'); lastColon != -1)
                enumName = enumName.sliced(lastColon + 1);
            return metaObject->enumerator(metaObject->indexOfEnumerator(enumName));
        }
    }
    return QMetaEnum();
}